

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void anon_unknown.dwarf_26ba73::PulsePlayback::sinkInfoCallbackC
               (pa_context *context,pa_sink_info *info,int eol,void *pdata)

{
  pa_channel_map *ppVar1;
  pa_sink_port_info *ppVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  char chanmap_str [336];
  undefined1 auStack_178 [344];
  
  if (eol != 0) {
    std::condition_variable::notify_all();
    return;
  }
  ppVar1 = &info->channel_map;
  iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1,&DAT_0018bbc4);
  if (iVar3 == 0) {
    iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1,&DAT_0018bc4c);
    lVar4 = 0x88;
    if (iVar3 == 0) {
      iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1,&DAT_0018bcd4);
      lVar4 = 0x110;
      if (iVar3 == 0) {
        iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1,&DAT_0018bd5c);
        lVar4 = 0x198;
        if (iVar3 == 0) {
          iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1,&DAT_0018bde4);
          lVar4 = 0x220;
          if (iVar3 == 0) {
            iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1,&DAT_0018be6c);
            lVar4 = 0x2a8;
            if (iVar3 == 0) {
              iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
              lVar4 = 0x330;
              if (iVar3 == 0) {
                memset(auStack_178,0,0x150);
                (*(anonymous_namespace)::ppa_channel_map_snprint)(auStack_178,0x150,ppVar1);
                if (1 < (int)gLogLevel) {
                  fprintf((FILE *)gLogFile,
                          "[ALSOFT] (WW) Failed to find format for channel map:\n    %s\n",
                          auStack_178);
                }
                goto LAB_001623b4;
              }
            }
          }
        }
      }
    }
  }
  else {
    lVar4 = 0;
  }
  if ((*(byte *)(*(long *)((long)pdata + 8) + 0x48) & 2) == 0) {
    *(undefined1 *)(*(long *)((long)pdata + 8) + 0x18) =
         (&(anonymous_namespace)::PulsePlayback::
           sinkInfoCallback(pa_context*,pa_sink_info_const*,int)::chanmaps)[lVar4];
  }
LAB_001623b4:
  ppVar2 = info->active_port;
  if ((ppVar2 != (pa_sink_port_info *)0x0) && (2 < (int)gLogLevel)) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Active port: %s (%s)\n",ppVar2->name,ppVar2->description
           );
  }
  lVar4 = *(long *)((long)pdata + 8);
  if ((*(char *)(lVar4 + 0x18) == '\x01') && (info->active_port != (pa_sink_port_info *)0x0)) {
    iVar3 = strcmp(info->active_port->name,"analog-output-headphones");
    bVar5 = iVar3 == 0;
  }
  else {
    bVar5 = false;
  }
  *(bool *)(lVar4 + 0x1a) = bVar5;
  return;
}

Assistant:

static void sinkInfoCallbackC(pa_context *context, const pa_sink_info *info, int eol, void *pdata) noexcept
    { static_cast<PulsePlayback*>(pdata)->sinkInfoCallback(context, info, eol); }